

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O0

LY_ERR lyplg_type_parse_int
                 (char *datatype,int base,int64_t min,int64_t max,char *value,size_t value_len,
                 int64_t *ret,ly_err_item **err)

{
  LY_ERR LVar1;
  ushort **ppuVar2;
  bool bVar3;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  size_t local_40;
  size_t value_len_local;
  char *value_local;
  int64_t max_local;
  int64_t min_local;
  int base_local;
  char *datatype_local;
  
  if (err == (ly_err_item **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","err",
           "lyplg_type_parse_int");
    datatype_local._4_4_ = LY_EINVAL;
  }
  else if (datatype == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","datatype",
           "lyplg_type_parse_int");
    datatype_local._4_4_ = LY_EINVAL;
  }
  else {
    *err = (ly_err_item *)0x0;
    local_40 = value_len;
    value_len_local = (size_t)value;
    while( true ) {
      bVar3 = false;
      if (local_40 != 0) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)*(char *)value_len_local] & 0x2000) != 0;
      }
      uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (!bVar3) break;
      value_len_local = value_len_local + 1;
      local_40 = local_40 - 1;
    }
    if (((value_len_local == 0) || (local_40 == 0)) || (*(char *)value_len_local == '\0')) {
      datatype_local._4_4_ =
           ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,"Invalid type %s empty value."
                      ,datatype);
    }
    else {
      LVar1 = ly_parse_int((char *)value_len_local,local_40,min,max,base,ret);
      if (LVar1 == LY_SUCCESS) {
        datatype_local._4_4_ = LY_SUCCESS;
      }
      else if (LVar1 == LY_EDENIED) {
        datatype_local._4_4_ =
             ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                        "Value \"%.*s\" is out of type %s min/max bounds.",
                        CONCAT44(uVar4,(int)local_40),value_len_local,datatype);
      }
      else {
        datatype_local._4_4_ =
             ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                        "Invalid type %s value \"%.*s\".",datatype,CONCAT44(uVar5,(int)local_40),
                        value_len_local);
      }
    }
  }
  return datatype_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_parse_int(const char *datatype, int base, int64_t min, int64_t max, const char *value, size_t value_len,
        int64_t *ret, struct ly_err_item **err)
{
    LY_CHECK_ARG_RET(NULL, err, datatype, LY_EINVAL);

    *err = NULL;

    /* consume leading whitespaces */
    for ( ; value_len && isspace(*value); ++value, --value_len) {}

    if (!value || !value_len || !value[0]) {
        return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid type %s empty value.", datatype);
    }

    switch (ly_parse_int(value, value_len, min, max, base, ret)) {
    case LY_EDENIED:
        return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL,
                "Value \"%.*s\" is out of type %s min/max bounds.", (int)value_len, value, datatype);
    case LY_SUCCESS:
        return LY_SUCCESS;
    default:
        return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL,
                "Invalid type %s value \"%.*s\".", datatype, (int)value_len, value);
    }
}